

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addImplicitData
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,DataStringT *data)

{
  Module *pMVar1;
  Memory *pMVar2;
  char *pcVar3;
  Const *pCVar4;
  undefined1 in_CL;
  string_view sVar5;
  Builder local_40;
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  __single_object d;
  
  pMVar1 = this->wasm;
  pMVar2 = (pMVar1->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
           super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
  local_38._M_head_impl = (DataSegment *)operator_new(0x50);
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&((local_38._M_head_impl)->super_Named).hasExplicitName = 0;
  ((local_38._M_head_impl)->memory).super_IString.str._M_len = 0;
  ((local_38._M_head_impl)->memory).super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(local_38._M_head_impl)->isPassive = 0;
  (local_38._M_head_impl)->offset = (Expression *)0x0;
  ((local_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_38._M_head_impl)->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar3 = *(char **)((long)&(pMVar2->super_Importable).super_Named + 8);
  ((local_38._M_head_impl)->memory).super_IString.str._M_len =
       *(size_t *)&(pMVar2->super_Importable).super_Named;
  ((local_38._M_head_impl)->memory).super_IString.str._M_str = pcVar3;
  (local_38._M_head_impl)->isPassive = false;
  local_40.wasm = pMVar1;
  pCVar4 = Builder::makeConstPtr(&local_40,0,(Type)(pMVar2->addressType).id);
  (local_38._M_head_impl)->offset = (Expression *)pCVar4;
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&(local_38._M_head_impl)->data,data);
  pMVar1 = this->wasm;
  sVar5 = IString::interned((IString *)0xd,(string_view)ZEXT816(0xe4404b),(bool)in_CL);
  sVar5 = (string_view)Names::getValidDataSegmentName(pMVar1,(Name)sVar5);
  ((local_38._M_head_impl)->super_Named).name.super_IString.str = sVar5;
  Module::addDataSegment
            (this->wasm,
             (unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
  if (local_38._M_head_impl != (DataSegment *)0x0) {
    std::default_delete<wasm::DataSegment>::operator()
              ((default_delete<wasm::DataSegment> *)&local_38,local_38._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addImplicitData(DataStringT&& data) {
  auto& mem = *wasm.memories.back();
  auto d = std::make_unique<DataSegment>();
  d->memory = mem.name;
  d->isPassive = false;
  d->offset = Builder(wasm).makeConstPtr(0, mem.addressType);
  d->data = std::move(data);
  d->name = Names::getValidDataSegmentName(wasm, "implicit-data");
  wasm.addDataSegment(std::move(d));
  return Ok{};
}